

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sys.c
# Opt level: O0

err_t cmdSysModulePath(char *path,size_t *count)

{
  int iVar1;
  long *in_RSI;
  long in_RDI;
  int len;
  int *in_stack_000020d8;
  int in_stack_000020e4;
  char *in_stack_000020e8;
  
  if (in_RDI == 0) {
    iVar1 = wai_getModulePath(in_stack_000020e8,in_stack_000020e4,in_stack_000020d8);
    if (iVar1 < 0) {
      return 0x65;
    }
    if (iVar1 + 1 < 1) {
      return 0x6f;
    }
    *in_RSI = (long)(iVar1 + 1);
  }
  else {
    if (*in_RSI == 0) {
      return 0x6e;
    }
    iVar1 = wai_getModulePath(in_stack_000020e8,in_stack_000020e4,in_stack_000020d8);
    if (iVar1 < 0) {
      return 0x65;
    }
    *in_RSI = (long)(iVar1 + 1);
  }
  return 0;
}

Assistant:

err_t cmdSysModulePath(char* path, size_t* count)
{
	int len;
	// pre
	ASSERT(memIsValid(count, O_PER_S));
	// определить длину пути
	if (!path)
	{
		len = wai_getModulePath(0, 0, 0);
		if (len < 0)
			return ERR_SYS;
		if (++len <= 0 || (int)(size_t)len != len)
			return ERR_OVERFLOW;
		*count = (size_t)len;
	}
	// определить путь
	else
	{
		ASSERT(memIsValid(path, *count));
		if (*count < 1)
			return ERR_OUTOFMEMORY;
		len = wai_getModulePath(path, (int)(*count - 1), 0);
		if (len < 0)
			return ERR_SYS;
		*count = (size_t)(len + 1);
	}
	return ERR_OK;
}